

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

float GD::compute_update<true,false,false,true,false,0ul,0ul,0ul>(gd *g,example *ec)

{
  uint uVar1;
  vw *pvVar2;
  shared_data *psVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  float fVar6;
  
  pvVar2 = g->all;
  uVar1 = (ec->l).multi.label;
  ec->updated_prediction = (float)(ec->pred).multiclass;
  (*pvVar2->loss->_vptr_loss_function[1])
            ((ulong)(ec->pred).multiclass,(ulong)uVar1,pvVar2->loss,pvVar2->sd);
  fVar6 = 0.0;
  if (0.0 < extraout_XMM0_Da) {
    fVar6 = ec->total_sum_feat_sq;
    fVar4 = get_scale<0ul>(g,ec,ec->weight);
    (*pvVar2->loss->_vptr_loss_function[3])
              ((ulong)(ec->pred).multiclass,(ulong)(ec->l).multi.label,
               CONCAT44(extraout_XMM0_Db,fVar4));
    ec->updated_prediction = fVar6 * extraout_XMM0_Da_00 + ec->updated_prediction;
    fVar6 = extraout_XMM0_Da_00;
    if ((pvVar2->reg_mode != 0) && (1e-08 < ABS(extraout_XMM0_Da_00))) {
      (*pvVar2->loss->_vptr_loss_function[6])
                ((ulong)(ec->pred).multiclass,(ulong)(ec->l).multi.label,pvVar2->loss,pvVar2->sd);
      dVar5 = (double)extraout_XMM0_Da_01;
      if (1e-08 <= ABS(dVar5) && ABS(dVar5) != 1e-08) {
        pvVar2->sd->contraction =
             (1.0 - (double)pvVar2->l2_lambda * ((double)-extraout_XMM0_Da_00 / dVar5)) *
             pvVar2->sd->contraction;
      }
      psVar3 = pvVar2->sd;
      fVar6 = extraout_XMM0_Da_00 / (float)psVar3->contraction;
      psVar3->gravity =
           (double)(-(ulong)(1e-08 < ABS(dVar5)) & (ulong)((double)-extraout_XMM0_Da_00 / dVar5)) *
           (double)pvVar2->l1_lambda + psVar3->gravity;
    }
  }
  return fVar6 - g->sparse_l2 * (ec->pred).scalar;
}

Assistant:

float compute_update(gd& g, example& ec)
{
  // invariant: not a test label, importance weight > 0
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float update = 0.;
  ec.updated_prediction = ec.pred.scalar;
  if (all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) > 0.)
  {
    float pred_per_update = sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, false>(g, ec);
    float update_scale = get_scale<adaptive>(g, ec, ec.weight);
    if (invariant)
      update = all.loss->getUpdate(ec.pred.scalar, ld.label, update_scale, pred_per_update);
    else
      update = all.loss->getUnsafeUpdate(ec.pred.scalar, ld.label, update_scale);
    // changed from ec.partial_prediction to ld.prediction
    ec.updated_prediction += pred_per_update * update;

    if (all.reg_mode && fabs(update) > 1e-8)
    {
      double dev1 = all.loss->first_derivative(all.sd, ec.pred.scalar, ld.label);
      double eta_bar = (fabs(dev1) > 1e-8) ? (-update / dev1) : 0.0;
      if (fabs(dev1) > 1e-8)
        all.sd->contraction *= (1. - all.l2_lambda * eta_bar);
      update /= (float)all.sd->contraction;
      all.sd->gravity += eta_bar * all.l1_lambda;
    }
  }

  if (sparse_l2)
    update -= g.sparse_l2 * ec.pred.scalar;

  return update;
}